

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O0

void __thiscall Fl_Function_Type::write_code2(Fl_Function_Type *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcStack_20;
  char havechildren;
  char *var;
  Fl_Type *child;
  Fl_Function_Type *this_local;
  
  pcStack_20 = "w";
  bVar2 = false;
  var = (char *)(this->super_Fl_Type).next;
  while( true ) {
    bVar1 = false;
    if (var != (char *)0x0) {
      bVar1 = (this->super_Fl_Type).level < *(int *)(var + 0x48);
    }
    if (!bVar1) break;
    bVar2 = true;
    iVar3 = (**(code **)(*(long *)var + 0x108))();
    if ((iVar3 != 0) && (pcVar4 = Fl_Type::name((Fl_Type *)var), pcVar4 != (char *)0x0)) {
      pcStack_20 = Fl_Type::name((Fl_Type *)var);
    }
    var = *(char **)(var + 0x50);
  }
  iVar3 = ismain(this);
  if (iVar3 == 0) {
    if (((this->havewidgets != '\0') && (this->constructor == '\0')) &&
       (this->return_type == (char *)0x0)) {
      write_c("  return %s;\n",pcStack_20);
    }
  }
  else {
    if (this->havewidgets != '\0') {
      write_c("  %s->show(argc, argv);\n",pcStack_20);
    }
    if (bVar2) {
      write_c("  return Fl::run();\n");
    }
  }
  if (bVar2) {
    write_c("}\n");
  }
  indentation = 0;
  return;
}

Assistant:

void Fl_Function_Type::write_code2() {
  Fl_Type *child;
  const char *var = "w";
  char havechildren = 0;
  for (child = next; child && child->level > level; child = child->next) {
    havechildren = 1;
    if (child->is_window() && child->name()) var = child->name();
  }
  
  if (ismain()) {
    if (havewidgets) write_c("  %s->show(argc, argv);\n", var);
    if (havechildren) write_c("  return Fl::run();\n");
  } else if (havewidgets && !constructor && !return_type) {
    write_c("  return %s;\n", var);
  }
  if (havechildren)
    write_c("}\n");
  indentation = 0;
}